

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall
factory_item<xray_re::se_smart_terrain>::create(factory_item<xray_re::se_smart_terrain> *this)

{
  se_smart_terrain *this_00;
  
  this_00 = (se_smart_terrain *)operator_new(0x140);
  xray_re::se_smart_terrain::se_smart_terrain(this_00);
  *(anon_union_8_3_e9edf90f_for_xr_clsid_0 *)&this_00->field_0xa0 =
       (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}